

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int cmsysProcess_WaitForExit(cmsysProcess *cp,double *userTimeout)

{
  int iVar1;
  int local_24;
  int prPipe;
  double *userTimeout_local;
  cmsysProcess *cp_local;
  
  if ((cp == (cmsysProcess *)0x0) || (cp->State != 3)) {
    cp_local._4_4_ = 1;
  }
  else {
    do {
      iVar1 = cmsysProcess_WaitForData(cp,(char **)0x0,(int *)0x0,userTimeout);
      if (iVar1 < 1) {
        if (cp->State == 1) {
          kwsysProcessCleanup(cp,0);
          return 1;
        }
        if (cp->SelectError != 0) {
          kwsysProcessCleanup(cp,0);
          cp->State = 1;
          return 1;
        }
        if (cp->Killed == 0) {
          if (cp->TimeoutExpired == 0) {
            for (local_24 = 0; local_24 < cp->NumberOfCommands; local_24 = local_24 + 1) {
              cp->ProcessResults[local_24].ExitCode = cp->CommandExitCodes[local_24];
              if ((cp->ProcessResults[local_24].ExitCode & 0x7fU) == 0) {
                cp->ProcessResults[local_24].State = 4;
                cp->ProcessResults[local_24].ExitException = 0;
                cp->ProcessResults[local_24].ExitValue =
                     (int)(cp->ProcessResults[local_24].ExitCode & 0xff00U) >> 8;
              }
              else if ((char)(((byte)cp->ProcessResults[local_24].ExitCode & 0x7f) + 1) >> 1 <
                       '\x01') {
                strcpy(cp->ProcessResults[local_24].ExitExceptionString,
                       "Error getting child return code.");
                cp->ProcessResults[local_24].State = 1;
              }
              else {
                cp->ProcessResults[local_24].State = 2;
                kwsysProcessSetExitExceptionByIndex
                          (cp,cp->ProcessResults[local_24].ExitCode & 0x7f,local_24);
              }
            }
            cp->State = cp->ProcessResults[cp->NumberOfCommands + -1].State;
          }
          else {
            cp->State = 5;
          }
        }
        else {
          cp->State = 6;
        }
        kwsysProcessCleanup(cp,0);
        return 1;
      }
    } while (iVar1 != 0xff);
    cp_local._4_4_ = 0;
  }
  return cp_local._4_4_;
}

Assistant:

int kwsysProcess_WaitForExit(kwsysProcess* cp, double* userTimeout)
{
  int prPipe = 0;

  /* Make sure we are executing a process.  */
  if (!cp || cp->State != kwsysProcess_State_Executing) {
    return 1;
  }

  /* Wait for all the pipes to close.  Ignore all data.  */
  while ((prPipe = kwsysProcess_WaitForData(cp, 0, 0, userTimeout)) > 0) {
    if (prPipe == kwsysProcess_Pipe_Timeout) {
      return 0;
    }
  }

  /* Check if there was an error in one of the waitpid calls.  */
  if (cp->State == kwsysProcess_State_Error) {
    /* The error message is already in its buffer.  Tell
       kwsysProcessCleanup to not create it.  */
    kwsysProcessCleanup(cp, 0);
    return 1;
  }

  /* Check whether the child reported an error invoking the process.  */
  if (cp->SelectError) {
    /* The error message is already in its buffer.  Tell
       kwsysProcessCleanup to not create it.  */
    kwsysProcessCleanup(cp, 0);
    cp->State = kwsysProcess_State_Error;
    return 1;
  }
  /* Determine the outcome.  */
  if (cp->Killed) {
    /* We killed the child.  */
    cp->State = kwsysProcess_State_Killed;
  } else if (cp->TimeoutExpired) {
    /* The timeout expired.  */
    cp->State = kwsysProcess_State_Expired;
  } else {
    /* The children exited.  Report the outcome of the child processes.  */
    for (prPipe = 0; prPipe < cp->NumberOfCommands; ++prPipe) {
      cp->ProcessResults[prPipe].ExitCode = cp->CommandExitCodes[prPipe];
      if (WIFEXITED(cp->ProcessResults[prPipe].ExitCode)) {
        /* The child exited normally.  */
        cp->ProcessResults[prPipe].State = kwsysProcess_StateByIndex_Exited;
        cp->ProcessResults[prPipe].ExitException = kwsysProcess_Exception_None;
        cp->ProcessResults[prPipe].ExitValue =
          // NOLINTNEXTLINE(google-readability-casting)
          (int)WEXITSTATUS(cp->ProcessResults[prPipe].ExitCode);
      } else if (WIFSIGNALED(cp->ProcessResults[prPipe].ExitCode)) {
        /* The child received an unhandled signal.  */
        cp->ProcessResults[prPipe].State = kwsysProcess_State_Exception;
        kwsysProcessSetExitExceptionByIndex(
          // NOLINTNEXTLINE(google-readability-casting)
          cp, (int)WTERMSIG(cp->ProcessResults[prPipe].ExitCode), prPipe);
      } else {
        /* Error getting the child return code.  */
        strcpy(cp->ProcessResults[prPipe].ExitExceptionString,
               "Error getting child return code.");
        cp->ProcessResults[prPipe].State = kwsysProcess_StateByIndex_Error;
      }
    }
    /* support legacy state status value */
    cp->State = cp->ProcessResults[cp->NumberOfCommands - 1].State;
  }
  /* Normal cleanup.  */
  kwsysProcessCleanup(cp, 0);
  return 1;
}